

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall
FlowGraph::InsertEdgeFromFinallyToEarlyExit
          (FlowGraph *this,BasicBlock *finallyEndBlock,LabelInstr *exitLabel)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LabelInstr *instr;
  Instr *pIVar4;
  BranchInstr *pBVar5;
  LabelInstr *instr_00;
  FlowEdge *pFVar6;
  Func **ppFVar7;
  BasicBlock *nextBlock;
  long lVar8;
  FlowGraph *this_00;
  FlowGraph *this_01;
  BasicBlock *pBVar9;
  Region *local_60;
  BasicBlock *local_58;
  FlowGraph *local_50;
  LabelInstr *local_48;
  Instr *local_40;
  Instr *local_38;
  
  pBVar9 = finallyEndBlock->next;
  local_38 = finallyEndBlock->firstInstr;
  ppFVar7 = (Func **)&pBVar9->firstInstr;
  if (pBVar9 == (BasicBlock *)0x0) {
    ppFVar7 = &finallyEndBlock->func;
  }
  lVar8 = 0x18;
  if (pBVar9 == (BasicBlock *)0x0) {
    lVar8 = 0xd0;
  }
  pIVar4 = *(Instr **)((long)&(*ppFVar7)->m_alloc + lVar8);
  if ((local_38->m_kind != InstrKindLabel) && (local_38->m_kind != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar2) goto LAB_0041802b;
    *puVar3 = 0;
  }
  pBVar9 = finallyEndBlock;
  if ((1 < pIVar4->m_opcode - 0xea) && (pIVar4->m_opcode != BrOnException)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x2b5,
                       "(lastInstr->m_opcode == Js::OpCode::LeaveNull || lastInstr->m_opcode == Js::OpCode::Leave || lastInstr->m_opcode == Js::OpCode::BrOnException)"
                       ,
                       "lastInstr->m_opcode == Js::OpCode::LeaveNull || lastInstr->m_opcode == Js::OpCode::Leave || lastInstr->m_opcode == Js::OpCode::BrOnException"
                      );
    if (!bVar2) {
LAB_0041802b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  do {
    pBVar9 = pBVar9->next;
    if (pBVar9 == (BasicBlock *)0x0) break;
  } while ((pBVar9->field_0x18 & 1) != 0);
  local_48 = exitLabel;
  instr = IR::LabelInstr::New(Label,this->func,false);
  IR::Instr::InsertBefore(pIVar4,&instr->super_Instr);
  AddBlock(this,&instr->super_Instr,pIVar4,pBVar9,finallyEndBlock);
  instr->m_region = (Region *)local_38[1].m_src2;
  AddEdge(this,finallyEndBlock,instr->m_block);
  local_40 = pIVar4;
  pIVar4 = IR::Instr::GetPrevRealInstrOrLabel(pIVar4);
  instr_00 = local_48;
  local_50 = this;
  if ((pIVar4->m_kind == InstrKindLabel) || (pIVar4->m_kind == InstrKindProfiledLabel)) {
    pBVar5 = IR::BranchInstr::New(BrOnException,local_48,this->func);
    IR::Instr::SetByteCodeOffset(&pBVar5->super_Instr,local_40);
    pBVar5->field_0x58 = pBVar5->field_0x58 | 0x10;
    IR::Instr::InsertBefore(&instr->super_Instr,&pBVar5->super_Instr);
    this_01 = local_50;
  }
  else {
    instr_00 = IR::LabelInstr::New(Label,this->func,false);
    IR::Instr::InsertBefore(&instr->super_Instr,&instr_00->super_Instr);
    pBVar5 = IR::BranchInstr::New(BrOnException,local_48,this->func);
    pBVar5->field_0x58 = pBVar5->field_0x58 | 0x10;
    IR::Instr::SetByteCodeOffset(&pBVar5->super_Instr,local_40);
    IR::Instr::InsertBefore(&instr->super_Instr,&pBVar5->super_Instr);
    this_01 = local_50;
    nextBlock = finallyEndBlock;
    do {
      nextBlock = nextBlock->next;
      if (nextBlock == (BasicBlock *)0x0) break;
    } while ((nextBlock->field_0x18 & 1) != 0);
    AddBlock(local_50,&instr_00->super_Instr,&pBVar5->super_Instr,nextBlock,finallyEndBlock);
    instr_00->m_region = (Region *)local_38[1].m_src2;
  }
  this_00 = this_01;
  AddEdge(this_01,finallyEndBlock,instr_00->m_block);
  pFVar6 = FindEdge(this_00,finallyEndBlock,pBVar9);
  if (pFVar6 != (FlowEdge *)0x0) {
    BasicBlock::RemoveSucc(finallyEndBlock,pBVar9,this_01,true,false);
  }
  local_60 = (Region *)local_38[1].m_src2;
  local_58 = instr->m_block;
  JsUtil::
  BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
            ((BaseDictionary<Region*,BasicBlock*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)this_01->regToFinallyEndMap,&local_60,&local_58);
  return;
}

Assistant:

void FlowGraph::InsertEdgeFromFinallyToEarlyExit(BasicBlock *finallyEndBlock, IR::LabelInstr *exitLabel)
{
    IR::Instr * lastInstr = finallyEndBlock->GetLastInstr();
    IR::LabelInstr * lastLabel = finallyEndBlock->GetFirstInstr()->AsLabelInstr();

    Assert(lastInstr->m_opcode == Js::OpCode::LeaveNull || lastInstr->m_opcode == Js::OpCode::Leave || lastInstr->m_opcode == Js::OpCode::BrOnException);
    // Add a new block, add BrOnException to earlyexit, assign region
    // Finally
    // ...
    // L1:
    // LeaveNull
    // to
    // Finally
    // ...
    // L1:
    // BrOnException earlyExitLabel
    // L1':
    // LeaveNull

    BasicBlock *nextBB = finallyEndBlock->GetNext();

    IR::LabelInstr *leaveLabel = IR::LabelInstr::New(Js::OpCode::Label, this->func);
    lastInstr->InsertBefore(leaveLabel);

    this->AddBlock(leaveLabel, lastInstr, nextBB, finallyEndBlock /*prevBlock*/);
    leaveLabel->SetRegion(lastLabel->GetRegion());

    this->AddEdge(finallyEndBlock, leaveLabel->GetBasicBlock());

    // If the Leave/LeaveNull at the end of finally was not preceeded by a Label, we have to create a new block with BrOnException to early exit
    if (!lastInstr->GetPrevRealInstrOrLabel()->IsLabelInstr())
    {
        IR::LabelInstr *brLabel = IR::LabelInstr::New(Js::OpCode::Label, this->func);
        leaveLabel->InsertBefore(brLabel);

        IR::BranchInstr *brToExit = IR::BranchInstr::New(Js::OpCode::BrOnException, exitLabel, this->func);
        brToExit->m_brFinallyToEarlyExit = true;
        brToExit->SetByteCodeOffset(lastInstr);
        leaveLabel->InsertBefore(brToExit);

        this->AddBlock(brLabel, brToExit, finallyEndBlock->GetNext(), finallyEndBlock /*prevBlock*/);
        brLabel->SetRegion(lastLabel->GetRegion());

        this->AddEdge(finallyEndBlock, brLabel->GetBasicBlock());
    }
    else
    {
        // If the Leave/LeaveNull at the end of finally was preceeded by a Label, we reuse the block inserting BrOnException to early exit in it
        IR::BranchInstr *brToExit = IR::BranchInstr::New(Js::OpCode::BrOnException, exitLabel, this->func);
        brToExit->SetByteCodeOffset(lastInstr);
        brToExit->m_brFinallyToEarlyExit = true;
        leaveLabel->InsertBefore(brToExit);
        this->AddEdge(finallyEndBlock, exitLabel->GetBasicBlock());
    }

    // In case of throw/non-terminating loop, there maybe no edge to the next block
    if (this->FindEdge(finallyEndBlock, nextBB))
    {
        finallyEndBlock->RemoveSucc(nextBB, this);
    }

    this->regToFinallyEndMap->Item(lastLabel->GetRegion(), leaveLabel->GetBasicBlock());
}